

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# separable_info.c
# Opt level: O2

double inform_separable_info
                 (int *srcs,int *dest,size_t l,size_t n,size_t m,int b,size_t k,inform_error *err)

{
  _Bool _Var1;
  bool bVar2;
  double dVar3;
  double local_58;
  double local_50;
  
  if (l == 0) {
    local_58 = NAN;
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOSOURCES;
    }
  }
  else {
    local_50 = inform_active_info(dest,n,m,b,k,err);
    _Var1 = inform_failed(err);
    local_58 = NAN;
    if (!_Var1) {
      while (bVar2 = l != 0, l = l - 1, bVar2) {
        dVar3 = inform_transfer_entropy(srcs,dest,(int *)0x0,0,n,m,b,k,err);
        _Var1 = inform_failed(err);
        if (_Var1) {
          return NAN;
        }
        local_50 = local_50 + dVar3;
        srcs = srcs + m * n;
      }
      local_58 = local_50;
    }
  }
  return local_58;
}

Assistant:

double inform_separable_info(int const *srcs, int const *dest, size_t l,
    size_t n, size_t m, int b, size_t k, inform_error *err)
{
    if (l < 1) INFORM_ERROR_RETURN(err, INFORM_ENOSOURCES, NAN);

    double si = inform_active_info(dest, n, m, b, k, err);
    if (inform_failed(err)) return NAN;

    for (size_t i = 0; i < l; ++i, srcs += n*m)
    {
        si += inform_transfer_entropy(srcs, dest, NULL, 0, n, m, b, k, err);
        if (inform_failed(err)) return NAN;
    }

    return si;
}